

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::DoubleRange::Clear(DoubleRange *this)

{
  uint32_t cached_has_bits;
  DoubleRange *this_local;
  
  memset(&this->minvalue_,0,0x10);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void DoubleRange::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.DoubleRange)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&minvalue_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&maxvalue_) -
      reinterpret_cast<char*>(&minvalue_)) + sizeof(maxvalue_));
  _internal_metadata_.Clear<std::string>();
}